

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O3

void __thiscall VcprojGenerator::initFormFiles(VcprojGenerator *this)

{
  VCFilter *this_00;
  QMakeProject *this_01;
  ProStringList *fileList;
  long in_FS_OFFSET;
  QAnyStringView QVar1;
  QAnyStringView QVar2;
  QAnyStringView QVar3;
  ProKey local_58;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &(this->vcProject).FormFiles;
  QVar1.m_size = (size_t)"Form Files";
  QVar1.field_0.m_data = this_00;
  QString::assign(QVar1);
  (this->vcProject).FormFiles.ParseFiles = _False;
  QVar2.m_size = (size_t)"ui";
  QVar2.field_0.m_data = &(this->vcProject).FormFiles.Filter;
  QString::assign(QVar2);
  QVar3.m_size = (size_t)"{99349809-55BA-4b9d-BF79-8FDBB0286EB3}";
  QVar3.field_0.m_data = &(this->vcProject).FormFiles.Guid;
  QString::assign(QVar3);
  this_01 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey(&local_58,"FORMS");
  fileList = QMakeEvaluator::valuesRef(&this_01->super_QMakeEvaluator,&local_58);
  VCFilter::addFiles(this_00,fileList);
  if (&(local_58.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_58.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  (this->vcProject).FormFiles.Project = this;
  (this->vcProject).FormFiles.Config = &(this->vcProject).Configuration;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void VcprojGenerator::initFormFiles()
{
    vcProject.FormFiles.Name = "Form Files";
    vcProject.FormFiles.ParseFiles = _False;
    vcProject.FormFiles.Filter = "ui";
    vcProject.FormFiles.Guid = _GUIDFormFiles;
    vcProject.FormFiles.addFiles(project->values("FORMS"));
    vcProject.FormFiles.Project = this;
    vcProject.FormFiles.Config = &(vcProject.Configuration);
}